

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl-int-reader.hpp
# Opt level: O1

uint64_t yactfr::internal::anon_unknown_0::readFlUIntLe49At6(uint8_t *buf)

{
  return ((ulong)((uint)buf[4] | (uint)buf[5] << 8 | (buf[6] & 0x7f) << 0x10) << 0x1a |
         (ulong)((uint)buf[2] << 10 | (uint)buf[3] << 0x12)) + (ulong)buf[1] * 4 |
         (ulong)(*buf >> 6);
}

Assistant:

std::uint64_t readFlUIntLe49At6(const std::uint8_t * const buf) {
    std::uint64_t res = 0;

    res |= buf[6];
    res <<= 8;
    res |= buf[5];
    res <<= 8;
    res |= buf[4];
    res <<= 8;
    res |= buf[3];
    res <<= 8;
    res |= buf[2];
    res <<= 8;
    res |= buf[1];
    res <<= 2;
    res |= (buf[0] >> 6);
    res &= UINT64_C(0x1ffffffffffff);
    return res;
}